

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O0

void JPCommonLabel_initialize(JPCommonLabel *label)

{
  JPCommonLabel *label_local;
  
  label->short_pause_flag = 0;
  label->breath_head = (JPCommonLabelBreathGroup *)0x0;
  label->breath_tail = (JPCommonLabelBreathGroup *)0x0;
  label->accent_head = (JPCommonLabelAccentPhrase *)0x0;
  label->accent_tail = (JPCommonLabelAccentPhrase *)0x0;
  label->word_head = (JPCommonLabelWord *)0x0;
  label->word_tail = (JPCommonLabelWord *)0x0;
  label->mora_head = (JPCommonLabelMora *)0x0;
  label->mora_tail = (JPCommonLabelMora *)0x0;
  label->phoneme_head = (JPCommonLabelPhoneme *)0x0;
  label->phoneme_tail = (JPCommonLabelPhoneme *)0x0;
  label->size = 0;
  label->feature = (char **)0x0;
  return;
}

Assistant:

void JPCommonLabel_initialize(JPCommonLabel * label)
{
   label->short_pause_flag = 0;
   label->breath_head = NULL;
   label->breath_tail = NULL;
   label->accent_head = NULL;
   label->accent_tail = NULL;
   label->word_head = NULL;
   label->word_tail = NULL;
   label->mora_head = NULL;
   label->mora_tail = NULL;
   label->phoneme_head = NULL;
   label->phoneme_tail = NULL;

   label->size = 0;
   label->feature = NULL;
}